

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

string * libwebm::GetTempFileName_abi_cxx11_(void)

{
  int __fd;
  char *pcVar1;
  char *pcVar2;
  string *in_RDI;
  string temp_file_name_template_str;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = getenv("TEST_TMPDIR");
  pcVar2 = ".";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)&local_68,pcVar2,&local_69);
  std::operator+(&local_48,&local_68,"/libwebm_temp.XXXXXX");
  std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = (char *)operator_new__(local_48._M_string_length + 1);
  memset(pcVar2,0,local_48._M_string_length + 1);
  std::__cxx11::string::copy((char *)&local_48,(ulong)pcVar2,local_48._M_string_length);
  __fd = mkstemp(pcVar2);
  if (__fd == -1) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    operator_delete__(pcVar2);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,pcVar2,(allocator *)&local_68);
    operator_delete__(pcVar2);
    close(__fd);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return in_RDI;
}

Assistant:

std::string GetTempFileName() {
#if !defined _MSC_VER && !defined __MINGW32__
  std::string temp_file_name_template_str =
      std::string(std::getenv("TEST_TMPDIR") ? std::getenv("TEST_TMPDIR")
                                             : ".") +
      "/libwebm_temp.XXXXXX";
  char* temp_file_name_template =
      new char[temp_file_name_template_str.length() + 1];
  memset(temp_file_name_template, 0, temp_file_name_template_str.length() + 1);
  temp_file_name_template_str.copy(temp_file_name_template,
                                   temp_file_name_template_str.length(), 0);
  int fd = mkstemp(temp_file_name_template);
  std::string temp_file_name =
      (fd != -1) ? std::string(temp_file_name_template) : std::string();
  delete[] temp_file_name_template;
  if (fd != -1) {
    close(fd);
  }
  return temp_file_name;
#else
  char tmp_file_name[_MAX_PATH];
#if defined _MSC_VER || defined MINGW_HAS_SECURE_API
  errno_t err = tmpnam_s(tmp_file_name);
#else
  char* fname_pointer = tmpnam(tmp_file_name);
  int err = (fname_pointer == &tmp_file_name[0]) ? 0 : -1;
#endif
  if (err == 0) {
    return std::string(tmp_file_name);
  }
  return std::string();
#endif
}